

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.cpp
# Opt level: O2

ExpressionType duckdb::WindowExpression::WindowToExpressionType(string *fun_name)

{
  bool bVar1;
  ExpressionType EVar2;
  
  bVar1 = ::std::operator==(fun_name,"rank");
  EVar2 = WINDOW_RANK;
  if (!bVar1) {
    bVar1 = ::std::operator==(fun_name,"rank_dense");
    EVar2 = WINDOW_RANK_DENSE;
    if (!bVar1) {
      bVar1 = ::std::operator==(fun_name,"dense_rank");
      if (!bVar1) {
        bVar1 = ::std::operator==(fun_name,"percent_rank");
        EVar2 = WINDOW_PERCENT_RANK;
        if (!bVar1) {
          bVar1 = ::std::operator==(fun_name,"row_number");
          EVar2 = WINDOW_ROW_NUMBER;
          if (!bVar1) {
            bVar1 = ::std::operator==(fun_name,"first_value");
            EVar2 = WINDOW_FIRST_VALUE;
            if (!bVar1) {
              bVar1 = ::std::operator==(fun_name,"first");
              if (!bVar1) {
                bVar1 = ::std::operator==(fun_name,"last_value");
                EVar2 = WINDOW_LAST_VALUE;
                if (!bVar1) {
                  bVar1 = ::std::operator==(fun_name,"last");
                  if (!bVar1) {
                    bVar1 = ::std::operator==(fun_name,"nth_value");
                    EVar2 = WINDOW_NTH_VALUE;
                    if (!bVar1) {
                      bVar1 = ::std::operator==(fun_name,"cume_dist");
                      EVar2 = WINDOW_CUME_DIST;
                      if (!bVar1) {
                        bVar1 = ::std::operator==(fun_name,"lead");
                        EVar2 = WINDOW_LEAD;
                        if (!bVar1) {
                          bVar1 = ::std::operator==(fun_name,"lag");
                          EVar2 = WINDOW_LAG;
                          if (!bVar1) {
                            bVar1 = ::std::operator==(fun_name,"ntile");
                            EVar2 = WINDOW_AGGREGATE;
                            if (bVar1) {
                              EVar2 = WINDOW_NTILE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ExpressionType WindowExpression::WindowToExpressionType(string &fun_name) {
	if (fun_name == "rank") {
		return ExpressionType::WINDOW_RANK;
	} else if (fun_name == "rank_dense" || fun_name == "dense_rank") {
		return ExpressionType::WINDOW_RANK_DENSE;
	} else if (fun_name == "percent_rank") {
		return ExpressionType::WINDOW_PERCENT_RANK;
	} else if (fun_name == "row_number") {
		return ExpressionType::WINDOW_ROW_NUMBER;
	} else if (fun_name == "first_value" || fun_name == "first") {
		return ExpressionType::WINDOW_FIRST_VALUE;
	} else if (fun_name == "last_value" || fun_name == "last") {
		return ExpressionType::WINDOW_LAST_VALUE;
	} else if (fun_name == "nth_value") {
		return ExpressionType::WINDOW_NTH_VALUE;
	} else if (fun_name == "cume_dist") {
		return ExpressionType::WINDOW_CUME_DIST;
	} else if (fun_name == "lead") {
		return ExpressionType::WINDOW_LEAD;
	} else if (fun_name == "lag") {
		return ExpressionType::WINDOW_LAG;
	} else if (fun_name == "ntile") {
		return ExpressionType::WINDOW_NTILE;
	}
	return ExpressionType::WINDOW_AGGREGATE;
}